

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQInteger sq_getsize(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQSharedState *pSVar3;
  SQObjectType type;
  HSQUIRRELVM unaff_retaddr;
  SQObjectPtr *o;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  undefined8 in_stack_fffffffffffffff8;
  SQObjectType type_00;
  
  type_00 = (SQObjectType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  pSVar2 = stack_get(in_stack_ffffffffffffffe0,
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_STRING) {
    pSVar3 = (((pSVar2->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
             _sharedstate;
  }
  else if (SVar1 == OT_ARRAY) {
    pSVar3 = (SQSharedState *)SQArray::Size((SQArray *)0x116b9a);
  }
  else if (SVar1 == OT_CLASS) {
    pSVar3 = (SQSharedState *)((pSVar2->super_SQObject)._unVal.pClass)->_udsize;
  }
  else if (SVar1 == OT_TABLE) {
    pSVar3 = (SQSharedState *)SQTable::CountUsed((pSVar2->super_SQObject)._unVal.pTable);
  }
  else if (SVar1 == OT_USERDATA) {
    pSVar3 = (SQSharedState *)((pSVar2->super_SQObject)._unVal.pTable)->_firstfree;
  }
  else if (SVar1 == OT_INSTANCE) {
    pSVar3 = (SQSharedState *)((pSVar2->super_SQObject)._unVal.pClass)->_base->_udsize;
  }
  else {
    pSVar3 = (SQSharedState *)sq_aux_invalidtype(unaff_retaddr,type_00);
  }
  return (SQInteger)pSVar3;
}

Assistant:

SQInteger sq_getsize(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectType type = type(o);
    switch(type) {
    case OT_STRING:     return _string(o)->_len;
    case OT_TABLE:      return _table(o)->CountUsed();
    case OT_ARRAY:      return _array(o)->Size();
    case OT_USERDATA:   return _userdata(o)->_size;
    case OT_INSTANCE:   return _instance(o)->_class->_udsize;
    case OT_CLASS:      return _class(o)->_udsize;
    default:
        return sq_aux_invalidtype(v, type);
    }
}